

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O2

int Rtm_ManLatchMax(Rtm_Man_t *p)

{
  void *pvVar1;
  ulong uVar2;
  uint uVar3;
  int i;
  uint uVar4;
  
  uVar3 = 0;
  for (i = 0; i < p->vObjs->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vObjs,i);
    for (uVar2 = 0; (*(uint *)((long)pvVar1 + 8) >> 3 & 0xff0) != uVar2; uVar2 = uVar2 + 0x10) {
      uVar4 = *(uint *)((long)pvVar1 + uVar2 + 0x20) & 0xfff;
      if (uVar3 <= uVar4) {
        uVar3 = uVar4;
      }
    }
  }
  return uVar3;
}

Assistant:

int Rtm_ManLatchMax( Rtm_Man_t * p )
{
    Rtm_Obj_t * pObj;
    Rtm_Edg_t * pEdge;
    int nLatchMax = 0, i, k;//, c, Val;
    Rtm_ManForEachObj( p, pObj, i )
    Rtm_ObjForEachFaninEdge( pObj, pEdge, k )
    {
/*
        for ( c = 0; c < (int)pEdge->nLats; c++ )
        {
            Val = Rtm_ObjGetOne( p, pEdge, c );
            assert( Val == 1 || Val == 2 );
        }
*/
        nLatchMax = Abc_MaxInt( nLatchMax, (int)pEdge->nLats );
    }
    return nLatchMax;
}